

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void writeRuleText(FILE *out,rule *rp)

{
  symbol *psVar1;
  long lVar2;
  long lVar3;
  
  fprintf((FILE *)out,"%s ::=",rp->lhs->name);
  for (lVar2 = 0; lVar2 < rp->nrhs; lVar2 = lVar2 + 1) {
    psVar1 = rp->rhs[lVar2];
    if (psVar1->type == MULTITERMINAL) {
      fprintf((FILE *)out," %s",(*psVar1->subsym)->name);
      for (lVar3 = 1; lVar3 < psVar1->nsubsym; lVar3 = lVar3 + 1) {
        fprintf((FILE *)out,"|%s",psVar1->subsym[lVar3]->name);
      }
    }
    else {
      fprintf((FILE *)out," %s",psVar1->name);
    }
  }
  return;
}

Assistant:

static void writeRuleText(FILE *out, struct rule *rp){
  int j;
  fprintf(out,"%s ::=", rp->lhs->name);
  for(j=0; j<rp->nrhs; j++){
    struct symbol *sp = rp->rhs[j];
    if( sp->type!=MULTITERMINAL ){
      fprintf(out," %s", sp->name);
    }else{
      int k;
      fprintf(out," %s", sp->subsym[0]->name);
      for(k=1; k<sp->nsubsym; k++){
        fprintf(out,"|%s",sp->subsym[k]->name);
      }
    }
  }
}